

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::DefineOwnPropertyForArray
               (JavascriptArray *arr,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  BOOL BVar5;
  Var pvVar6;
  bool local_b9;
  uint local_b4;
  BOOL succeeded_1;
  uint32 index;
  PropertyDescriptor newWritableDesc;
  BOOL succeeded;
  bool newWritable;
  BOOL oldLenWritable;
  uint32 oldLen;
  uint32 newLen;
  PropertyDescriptor newLenDesc;
  ScriptContext *scriptContext_local;
  bool throwOnError_local;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  JavascriptArray *arr_local;
  
  newLenDesc._40_8_ = scriptContext;
  if (propId == 0xd1) {
    bVar1 = PropertyDescriptor::ValueSpecified(descriptor);
    if (bVar1) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&oldLen,descriptor);
      pvVar6 = PropertyDescriptor::GetValue(descriptor);
      uVar2 = ES5Array::ToLengthValue(pvVar6,(ScriptContext *)newLenDesc._40_8_);
      pvVar6 = JavascriptNumber::ToVar(uVar2,(ScriptContext *)newLenDesc._40_8_);
      PropertyDescriptor::SetValue((PropertyDescriptor *)&oldLen,pvVar6);
      uVar3 = ArrayObject::GetLength(&arr->super_ArrayObject);
      if (uVar2 < uVar3) {
        iVar4 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x30])(arr,0xd1);
        if (iVar4 == 0) {
          arr_local._4_4_ = Reject(throwOnError,(ScriptContext *)newLenDesc._40_8_,-0x7ff5ec29,0xd1)
          ;
        }
        else {
          bVar1 = PropertyDescriptor::WritableSpecified((PropertyDescriptor *)&oldLen);
          local_b9 = true;
          if (bVar1) {
            local_b9 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&oldLen);
          }
          if (local_b9 == false) {
            PropertyDescriptor::SetWritable((PropertyDescriptor *)&oldLen,true);
          }
          newWritableDesc._44_4_ =
               DefineOwnPropertyDescriptor
                         ((RecyclableObject *)arr,0xd1,(PropertyDescriptor *)&oldLen,throwOnError,
                          (ScriptContext *)newLenDesc._40_8_,PropertyOperation_None);
          if (newWritableDesc._44_4_ == 0) {
            arr_local._4_4_ = 0;
          }
          else {
            if (local_b9 == false) {
              PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&succeeded_1);
              PropertyDescriptor::SetWritable((PropertyDescriptor *)&succeeded_1,false);
              DefineOwnPropertyDescriptor
                        ((RecyclableObject *)arr,0xd1,(PropertyDescriptor *)&succeeded_1,false,
                         (ScriptContext *)newLenDesc._40_8_,PropertyOperation_None);
            }
            uVar3 = ArrayObject::GetLength(&arr->super_ArrayObject);
            if (uVar2 < uVar3) {
              arr_local._4_4_ =
                   Reject(throwOnError,(ScriptContext *)newLenDesc._40_8_,-0x7ff5ec27,0xd1);
            }
            else {
              arr_local._4_4_ = 1;
            }
          }
        }
      }
      else {
        arr_local._4_4_ =
             DefineOwnPropertyDescriptor
                       ((RecyclableObject *)arr,0xd1,(PropertyDescriptor *)&oldLen,throwOnError,
                        (ScriptContext *)newLenDesc._40_8_,PropertyOperation_None);
      }
    }
    else {
      arr_local._4_4_ =
           DefineOwnPropertyDescriptor
                     ((RecyclableObject *)arr,0xd1,descriptor,throwOnError,
                      (ScriptContext *)newLenDesc._40_8_,PropertyOperation_None);
    }
  }
  else {
    BVar5 = ScriptContext::IsNumericPropertyId(scriptContext,propId,&local_b4);
    if (BVar5 == 0) {
      arr_local._4_4_ =
           DefineOwnPropertyDescriptor
                     ((RecyclableObject *)arr,propId,descriptor,throwOnError,
                      (ScriptContext *)newLenDesc._40_8_,PropertyOperation_None);
    }
    else {
      uVar2 = ArrayObject::GetLength(&arr->super_ArrayObject);
      if ((local_b4 < uVar2) ||
         (iVar4 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x30])(arr,0xd1), iVar4 != 0)) {
        BVar5 = DefineOwnPropertyDescriptor
                          ((RecyclableObject *)arr,propId,descriptor,false,
                           (ScriptContext *)newLenDesc._40_8_,PropertyOperation_None);
        if (BVar5 == 0) {
          arr_local._4_4_ =
               Reject(throwOnError,(ScriptContext *)newLenDesc._40_8_,-0x7ff5ec27,propId);
        }
        else {
          arr_local._4_4_ = 1;
        }
      }
      else {
        arr_local._4_4_ = Reject(throwOnError,(ScriptContext *)newLenDesc._40_8_,-0x7ff5ec28,propId)
        ;
      }
    }
  }
  return arr_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyForArray(JavascriptArray* arr, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext)
    {
        if (propId == PropertyIds::length)
        {
            if (!descriptor.ValueSpecified())
            {
                return DefineOwnPropertyDescriptor(arr, PropertyIds::length, descriptor, throwOnError, scriptContext);
            }

            PropertyDescriptor newLenDesc = descriptor;
            uint32 newLen = ES5Array::ToLengthValue(descriptor.GetValue(), scriptContext);
            newLenDesc.SetValue(JavascriptNumber::ToVar(newLen, scriptContext));

            uint32 oldLen = arr->GetLength();
            if (newLen >= oldLen)
            {
                return DefineOwnPropertyDescriptor(arr, PropertyIds::length, newLenDesc, throwOnError, scriptContext);
            }

            BOOL oldLenWritable = arr->IsWritable(PropertyIds::length);
            if (!oldLenWritable)
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_NotWritable, propId);
            }

            bool newWritable = (!newLenDesc.WritableSpecified() || newLenDesc.IsWritable());
            if (!newWritable)
            {
                // Need to defer setting writable to false in case any elements cannot be deleted
                newLenDesc.SetWritable(true);
            }

            BOOL succeeded = DefineOwnPropertyDescriptor(arr, PropertyIds::length, newLenDesc, throwOnError, scriptContext);
            //
            // Our SetProperty(length) is also responsible to trim elements. When succeeded is
            //
            //  false:
            //      * length attributes rejected
            //      * elements not touched
            //  true:
            //      * length attributes are set successfully
            //      * elements trimming may be either completed or incompleted, length value is correct
            //
            //      * Strict mode TODO: Currently SetProperty(length) does not throw. If that throws, we need
            //        to update here to set correct newWritable even on exception.
            //
            if (!succeeded)
            {
                return false;
            }

            if (!newWritable) // Now set requested newWritable.
            {
                PropertyDescriptor newWritableDesc;
                newWritableDesc.SetWritable(false);
                DefineOwnPropertyDescriptor(arr, PropertyIds::length, newWritableDesc, false, scriptContext);
            }

            if (arr->GetLength() > newLen) // Delete incompleted
            {
                // Since SetProperty(length) not throwing, we'll reject here
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_Default, propId);
            }

            return true;
        }

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propId, &index))
        {
            if (index >= arr->GetLength() && !arr->IsWritable(PropertyIds::length))
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_LengthNotWritable, propId);
            }

            BOOL succeeded = DefineOwnPropertyDescriptor(arr, propId, descriptor, false, scriptContext);
            if (!succeeded)
            {
                return Reject(throwOnError, scriptContext, JSERR_DefineProperty_Default, propId);
            }

            // Out SetItem takes care of growing "length". we are done.
            return true;
        }

        return DefineOwnPropertyDescriptor(arr, propId, descriptor, throwOnError, scriptContext);
    }